

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcp.hpp
# Opt level: O0

void __thiscall
lcp<dna_bwt_n<dna_string_n>,_unsigned_int>::lcp
          (lcp<dna_bwt_n<dna_string_n>,_unsigned_int> *this,dna_bwt_n<dna_string_n> *bwt)

{
  bool bVar1;
  value_type vVar2;
  int iVar3;
  pointer puVar4;
  reference pvVar5;
  ostream *poVar6;
  reference pvVar7;
  size_type sVar8;
  void *pvVar9;
  size_type sVar10;
  reference pvVar11;
  ostream *poVar12;
  dna_bwt_n<dna_string_n> *in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  int *in_stack_000000c8;
  vector<sa_node_n,_std::allocator<sa_node_n>_> *in_stack_000000d0;
  sa_node_n *in_stack_000000d8;
  dna_bwt_n<dna_string_n> *in_stack_000000e0;
  int i_2;
  int t_1;
  sa_node_t N;
  int perc_1;
  int last_perc_1;
  sa_node_t root_1;
  stack<sa_node_n,_std::deque<sa_node_n,_std::allocator<sa_node_n>_>_> S_1;
  uint64_t nodes;
  vector<sa_node_n,_std::allocator<sa_node_n>_> TMP_NODES;
  int i_1;
  int t;
  uint64_t i;
  sa_leaf L;
  int perc;
  int last_perc;
  sa_leaf root;
  stack<sa_leaf,_std::deque<sa_leaf,_std::allocator<sa_leaf>_>_> S;
  vector<sa_leaf,_std::allocator<sa_leaf>_> TMP_LEAVES;
  uint64_t lcp_values;
  uint64_t max_stack;
  uint64_t leaves;
  uint64_t m;
  value_type *in_stack_fffffffffffffc68;
  stack<sa_leaf,_std::deque<sa_leaf,_std::allocator<sa_leaf>_>_> *in_stack_fffffffffffffc70;
  allocator_type *in_stack_fffffffffffffc78;
  dna_bwt_n<dna_string_n> *in_stack_fffffffffffffc80;
  size_type in_stack_fffffffffffffc88;
  vector<sa_leaf,_std::allocator<sa_leaf>_> *in_stack_fffffffffffffc90;
  size_type local_320;
  size_type local_268;
  int local_220;
  undefined8 in_stack_fffffffffffffdf0;
  int *in_stack_fffffffffffffdf8;
  vector<sa_leaf,_std::allocator<sa_leaf>_> *in_stack_fffffffffffffe00;
  uint64_t *lcp_values_00;
  sa_leaf *in_stack_fffffffffffffe08;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *LCP;
  dna_bwt_n<dna_string_n> *in_stack_fffffffffffffe10;
  sa_node_n *x;
  int local_1d4;
  sa_node_n local_1d0 [2];
  ulong local_140;
  vector<sa_node_n,_std::allocator<sa_node_n>_> local_130;
  int local_118;
  int local_114;
  ulong local_110;
  unsigned_long local_108;
  unsigned_long local_100;
  uint64_t local_f8;
  int local_f0;
  int local_ec;
  vector<sa_leaf,_std::allocator<sa_leaf>_> local_78;
  ulong local_60;
  size_type local_58;
  ulong local_50;
  ulong local_48;
  dna_bwt_n<dna_string_n> *local_10;
  
  local_10 = in_RSI;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1209b7);
  in_RDI[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  in_RDI[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined4 *)
   &in_RDI[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = 0xffffffff;
  puVar4 = (pointer)dna_bwt_n<dna_string_n>::size(local_10);
  in_RDI[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = puVar4;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x120a22);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffc90,
             in_stack_fffffffffffffc88,(value_type_conflict2 *)in_stack_fffffffffffffc80,
             in_stack_fffffffffffffc78);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffc80,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffc78);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffc80);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x120a80);
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RDI,0);
  *pvVar5 = 0;
  poVar6 = std::operator<<((ostream *)&std::cout,
                           "\nNow navigating suffix tree leaves of size >= 2 to compute internal LCP values."
                          );
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  local_48 = 0;
  local_50 = 0;
  local_58 = 0;
  local_60 = 1;
  std::allocator<sa_leaf>::allocator((allocator<sa_leaf> *)0x120b0f);
  std::vector<sa_leaf,_std::allocator<sa_leaf>_>::vector
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
             (allocator_type *)in_stack_fffffffffffffc80);
  std::allocator<sa_leaf>::~allocator((allocator<sa_leaf> *)0x120b38);
  std::stack<sa_leaf,std::deque<sa_leaf,std::allocator<sa_leaf>>>::
  stack<std::deque<sa_leaf,std::allocator<sa_leaf>>,void>(in_stack_fffffffffffffc70);
  dna_bwt_n<dna_string_n>::first_leaf(in_stack_fffffffffffffc80);
  std::stack<sa_leaf,_std::deque<sa_leaf,_std::allocator<sa_leaf>_>_>::push
            (in_stack_fffffffffffffc70,(value_type *)in_stack_fffffffffffffc68);
  local_ec = -1;
  local_f0 = 0;
  while (bVar1 = std::stack<sa_leaf,_std::deque<sa_leaf,_std::allocator<sa_leaf>_>_>::empty
                           ((stack<sa_leaf,_std::deque<sa_leaf,_std::allocator<sa_leaf>_>_> *)
                            0x120b98), ((bVar1 ^ 0xffU) & 1) != 0) {
    pvVar7 = std::stack<sa_leaf,_std::deque<sa_leaf,_std::allocator<sa_leaf>_>_>::top
                       ((stack<sa_leaf,_std::deque<sa_leaf,_std::allocator<sa_leaf>_>_> *)0x120bb0);
    local_108 = (pvVar7->rn).first;
    local_100 = (pvVar7->rn).second;
    local_f8 = pvVar7->depth;
    std::stack<sa_leaf,_std::deque<sa_leaf,_std::allocator<sa_leaf>_>_>::pop
              ((stack<sa_leaf,_std::deque<sa_leaf,_std::allocator<sa_leaf>_>_> *)0x120be0);
    local_50 = local_50 + 1;
    sVar8 = std::stack<sa_leaf,_std::deque<sa_leaf,_std::allocator<sa_leaf>_>_>::size
                      ((stack<sa_leaf,_std::deque<sa_leaf,_std::allocator<sa_leaf>_>_> *)0x120c01);
    if (local_58 < sVar8) {
      local_268 = std::stack<sa_leaf,_std::deque<sa_leaf,_std::allocator<sa_leaf>_>_>::size
                            ((stack<sa_leaf,_std::deque<sa_leaf,_std::allocator<sa_leaf>_>_> *)
                             0x120c18);
    }
    else {
      local_268 = local_58;
    }
    local_58 = local_268;
    local_110 = local_108;
    while (local_110 = local_110 + 1, local_110 < local_100) {
      vVar2 = (value_type)local_f8;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (in_RDI,local_110);
      *pvVar5 = vVar2;
      local_60 = local_60 + 1;
      local_48 = local_48 + 1;
    }
    local_48 = local_48 + 1;
    local_114 = 0;
    dna_bwt_n<dna_string_n>::next_leaves
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
               in_stack_fffffffffffffdf8,(int)((ulong)in_stack_fffffffffffffdf0 >> 0x20));
    local_118 = local_114;
    while (local_118 = local_118 + -1, -1 < local_118) {
      std::vector<sa_leaf,_std::allocator<sa_leaf>_>::operator[](&local_78,(long)local_118);
      std::stack<sa_leaf,_std::deque<sa_leaf,_std::allocator<sa_leaf>_>_>::push
                (in_stack_fffffffffffffc70,(value_type *)in_stack_fffffffffffffc68);
    }
    local_f0 = (int)((local_60 * 100) /
                    (ulong)in_RDI[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start);
    if (local_ec < local_f0) {
      poVar6 = std::operator<<((ostream *)&std::cout,"LCP: ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_f0);
      poVar6 = std::operator<<(poVar6,"%.");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      local_ec = local_f0;
    }
  }
  std::stack<sa_leaf,_std::deque<sa_leaf,_std::allocator<sa_leaf>_>_>::~stack
            ((stack<sa_leaf,_std::deque<sa_leaf,_std::allocator<sa_leaf>_>_> *)0x120edd);
  std::vector<sa_leaf,_std::allocator<sa_leaf>_>::~vector
            ((vector<sa_leaf,_std::allocator<sa_leaf>_> *)in_stack_fffffffffffffc80);
  poVar6 = std::operator<<((ostream *)&std::cout,"Visited leaves cover ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_48);
  poVar6 = std::operator<<(poVar6,"/");
  poVar6 = (ostream *)
           std::ostream::operator<<
                     (poVar6,(ulong)in_RDI[1].
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
  poVar6 = std::operator<<(poVar6," input characters.");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<((ostream *)&std::cout,"Computed ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_60);
  poVar6 = std::operator<<(poVar6,"/");
  poVar6 = (ostream *)
           std::ostream::operator<<
                     (poVar6,(ulong)in_RDI[1].
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
  poVar6 = std::operator<<(poVar6," LCP values.");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<((ostream *)&std::cout,"Max stack size = ");
  pvVar9 = (void *)std::ostream::operator<<(poVar6,local_58);
  std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<((ostream *)&std::cout,"Processed ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_50);
  poVar6 = std::operator<<(poVar6," suffix-tree leaves of size >= 2.");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<((ostream *)&std::cout,
                           "\nNow navigating suffix tree nodes to compute remaining LCP values.");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  std::allocator<sa_node_n>::allocator((allocator<sa_node_n> *)0x121156);
  std::vector<sa_node_n,_std::allocator<sa_node_n>_>::vector
            ((vector<sa_node_n,_std::allocator<sa_node_n>_> *)in_stack_fffffffffffffc90,
             in_stack_fffffffffffffc88,(allocator_type *)in_stack_fffffffffffffc80);
  std::allocator<sa_node_n>::~allocator((allocator<sa_node_n> *)0x12117f);
  local_140 = 0;
  local_58 = 0;
  std::stack<sa_node_n,std::deque<sa_node_n,std::allocator<sa_node_n>>>::
  stack<std::deque<sa_node_n,std::allocator<sa_node_n>>,void>
            ((stack<sa_node_n,_std::deque<sa_node_n,_std::allocator<sa_node_n>_>_> *)
             in_stack_fffffffffffffc70);
  dna_bwt_n<dna_string_n>::root(local_1d0,local_10);
  std::stack<sa_node_n,_std::deque<sa_node_n,_std::allocator<sa_node_n>_>_>::push
            ((stack<sa_node_n,_std::deque<sa_node_n,_std::allocator<sa_node_n>_>_> *)
             in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
  local_1d4 = -1;
  while (bVar1 = std::stack<sa_node_n,_std::deque<sa_node_n,_std::allocator<sa_node_n>_>_>::empty
                           ((stack<sa_node_n,_std::deque<sa_node_n,_std::allocator<sa_node_n>_>_> *)
                            0x1211fd), ((bVar1 ^ 0xffU) & 1) != 0) {
    sVar10 = std::stack<sa_node_n,_std::deque<sa_node_n,_std::allocator<sa_node_n>_>_>::size
                       ((stack<sa_node_n,_std::deque<sa_node_n,_std::allocator<sa_node_n>_>_> *)
                        0x121215);
    if (local_58 < sVar10) {
      local_320 = std::stack<sa_node_n,_std::deque<sa_node_n,_std::allocator<sa_node_n>_>_>::size
                            ((stack<sa_node_n,_std::deque<sa_node_n,_std::allocator<sa_node_n>_>_> *
                             )0x12122c);
    }
    else {
      local_320 = local_58;
    }
    local_58 = local_320;
    pvVar11 = std::stack<sa_node_n,_std::deque<sa_node_n,_std::allocator<sa_node_n>_>_>::top
                        ((stack<sa_node_n,_std::deque<sa_node_n,_std::allocator<sa_node_n>_>_> *)
                         0x12125f);
    lcp_values_00 = (uint64_t *)pvVar11->first_G;
    LCP = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)pvVar11->first_N;
    x = (sa_node_n *)pvVar11->first_T;
    std::stack<sa_node_n,_std::deque<sa_node_n,_std::allocator<sa_node_n>_>_>::pop
              ((stack<sa_node_n,_std::deque<sa_node_n,_std::allocator<sa_node_n>_>_> *)0x121298);
    local_140 = local_140 + 1;
    update_lcp<unsigned_int>(x,LCP,lcp_values_00);
    dna_bwt_n<dna_string_n>::next_nodes
              (in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,in_stack_000000c8);
    for (local_220 = -1; -1 < local_220; local_220 = local_220 + -1) {
      std::vector<sa_node_n,_std::allocator<sa_node_n>_>::operator[](&local_130,(long)local_220);
      std::stack<sa_node_n,_std::deque<sa_node_n,_std::allocator<sa_node_n>_>_>::push
                ((stack<sa_node_n,_std::deque<sa_node_n,_std::allocator<sa_node_n>_>_> *)
                 in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    }
    iVar3 = (int)((local_60 * 100) /
                 (ulong)in_RDI[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
    if (local_1d4 < iVar3) {
      poVar6 = std::operator<<((ostream *)&std::cout,"LCP: ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
      poVar6 = std::operator<<(poVar6,"%.");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      local_1d4 = iVar3;
    }
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"Computed ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_60);
  poVar6 = std::operator<<(poVar6,"/");
  poVar6 = (ostream *)
           std::ostream::operator<<
                     (poVar6,(ulong)in_RDI[1].
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
  poVar6 = std::operator<<(poVar6," LCP values.");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<((ostream *)&std::cout,"Max stack size = ");
  pvVar9 = (void *)std::ostream::operator<<(poVar6,local_58);
  std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<((ostream *)&std::cout,"Processed ");
  poVar12 = (ostream *)std::ostream::operator<<(poVar6,local_140);
  poVar12 = std::operator<<(poVar12," suffix-tree nodes.");
  std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
  std::stack<sa_node_n,_std::deque<sa_node_n,_std::allocator<sa_node_n>_>_>::~stack
            ((stack<sa_node_n,_std::deque<sa_node_n,_std::allocator<sa_node_n>_>_> *)0x1215b0);
  std::vector<sa_node_n,_std::allocator<sa_node_n>_>::~vector
            ((vector<sa_node_n,_std::allocator<sa_node_n>_> *)poVar6);
  return;
}

Assistant:

lcp(bwt_t * bwt){

		this->bwt;

		n = bwt->size();

		LCP = vector<lcp_int_t>(n, nil);
		LCP[0] = 0;

		/*
		 * FIRST PASS: LEAVES NAVIGATION. COMPUTE LCP VALUES INSIDE SUFFIX TREE LEAVES.
		 */

		cout << "\nNow navigating suffix tree leaves of size >= 2 to compute internal LCP values." << endl;

		uint64_t m = 0;//portion of text covered by visited leaves
		uint64_t leaves = 0;//number of visited leaves
		uint64_t max_stack = 0;
		uint64_t lcp_values = 1;//number of filled LCP values

		{

			auto TMP_LEAVES = vector<sa_leaf>(5);

			stack<sa_leaf> S;

			sa_leaf root = bwt->first_leaf();
			S.push(root);

			int last_perc = -1;
			int perc = 0;

			while(not S.empty()){

				sa_leaf L = S.top();
				S.pop();
				leaves++;

				max_stack = S.size() > max_stack ? S.size() : max_stack;

				assert(L.rn.second > L.rn.first);

				for(uint64_t i = L.rn.first+1; i<L.rn.second; ++i){

					assert(LCP[i]==nil);

					LCP[i] = L.depth;

					lcp_values++;
					m++;

				}

				m++;

				assert(m<=n);

				int t = 0;

				bwt->next_leaves(L, TMP_LEAVES, t, 2);

				for(int i=t-1;i>=0;--i) S.push(TMP_LEAVES[i]);

				perc = (100*lcp_values)/n;

				if(perc > last_perc){

					cout << "LCP: " << perc << "%." << endl;
					last_perc = perc;

				}

			}
		}

		cout << "Visited leaves cover " << m << "/" << n << " input characters." << endl;
		cout << "Computed " << lcp_values << "/" << n << " LCP values." << endl;

		cout << "Max stack size = " << max_stack << endl;
		cout << "Processed " << leaves << " suffix-tree leaves of size >= 2." << endl;

		cout << "\nNow navigating suffix tree nodes to compute remaining LCP values." << endl;

		{

			auto TMP_NODES = vector<typename bwt_t::sa_node_t>(5);

			uint64_t nodes = 0;//visited ST nodes
			max_stack = 0;

			stack<typename bwt_t::sa_node_t> S;

			typename bwt_t::sa_node_t root = bwt->root();

			S.push(root);

			int last_perc = -1;
			int perc = 0;

			while(not S.empty()){

				max_stack = S.size() > max_stack ? S.size() : max_stack;

				typename bwt_t::sa_node_t N = S.top();
				S.pop();
				nodes++;

				update_lcp<lcp_int_t>(N,LCP,lcp_values);

				int t = 0;

				bwt->next_nodes(N, TMP_NODES, t);

				for(int i=t-1;i>=0;--i){

					S.push(TMP_NODES[i]);

				}

				perc = (100*lcp_values)/n;

				if(perc > last_perc){

					cout << "LCP: " << perc << "%." << endl;
					last_perc = perc;

				}

			}

			cout << "Computed " << lcp_values << "/" << n << " LCP values." << endl;
			cout << "Max stack size = " << max_stack << endl;
			cout << "Processed " << nodes << " suffix-tree nodes." << endl;

		}


	}